

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O1

void __thiscall tli_window_manager::FrameBox::print(FrameBox *this,Canvas *canvas,int row,int col)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar2 = (long)row;
  lVar1 = (long)col;
  *(undefined1 *)
   (*(long *)&(canvas->
              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[lVar2].
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data +
   lVar1) = 0x2b;
  *(undefined1 *)
   (*(long *)&(canvas->
              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[(this->super_Box).height_ + lVar2 + -1].
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data +
   lVar1) = 0x2b;
  *(undefined1 *)
   (*(long *)&(canvas->
              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[(this->super_Box).height_ + lVar2 + -1].
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data + -1 +
   (this->super_Box).width_ + lVar1) = 0x2b;
  *(undefined1 *)
   (*(long *)&(canvas->
              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[lVar2].
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data + -1 +
   (this->super_Box).width_ + lVar1) = 0x2b;
  if (2 < (this->super_Box).width_) {
    lVar4 = 1;
    lVar3 = lVar1;
    do {
      lVar3 = lVar3 + 1;
      *(undefined1 *)
       (*(long *)&(canvas->
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar2].
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data +
       lVar3) = 0x2d;
      *(undefined1 *)
       (*(long *)&(canvas->
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[(this->super_Box).height_ + lVar2 + -1]
                  .super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data +
       lVar3) = 0x2d;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (long)(this->super_Box).width_ + -1);
  }
  if (2 < (this->super_Box).height_) {
    lVar3 = 1;
    lVar2 = lVar2 * 0x18;
    do {
      *(undefined1 *)
       (*(long *)((long)&(canvas->
                         super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[1].
                         super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar2) + lVar1) = 0x7c;
      *(undefined1 *)
       (*(long *)((long)&(canvas->
                         super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[1].
                         super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar2) + -1 +
       (this->super_Box).width_ + lVar1) = 0x7c;
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (lVar3 < (long)(this->super_Box).height_ + -1);
  }
  (*this->box_->_vptr_Box[1])(this->box_,canvas,(ulong)(row + 1),(ulong)(col + 1));
  return;
}

Assistant:

void FrameBox::print(Canvas &canvas, int row, int col) const {
    canvas[row][col] = '+';
    canvas[row + height_ - 1][col] = '+';
    canvas[row + height_ - 1][col + width_ - 1] = '+';
    canvas[row][col + width_ - 1] = '+';
    for (int i = 1; i < width_ - 1; ++i) {
        canvas[row][col + i] = '-';
        canvas[row + height_ - 1][col + i] = '-';
    }
    for (int j = 1; j < height_ - 1; ++j) {
        canvas[row + j][col] = '|';
        canvas[row + j][col + width_ - 1] = '|';
    }
    box_->print(canvas, row + 1, col + 1);
}